

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitRefIsNull(OptimizeInstructions *this,RefIsNull *curr)

{
  Drop *left;
  Const *right;
  Block *rep;
  bool bVar1;
  optional<wasm::Type> type;
  Literal local_48;
  Builder local_30;
  Builder builder;
  ulong uVar2;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression.type.id != 1) {
    local_30.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    uVar2 = (curr->value->type).id;
    bVar1 = (uVar2 & 3) != 0 || uVar2 < 7;
    uVar2 = CONCAT71((int7)(uVar2 >> 8),bVar1);
    if (bVar1) {
      skipCast(this,&curr->value,(Type)0x0);
    }
    else {
      left = Builder::makeDrop(&local_30,curr->value);
      Literal::makeZero(&local_48,(Type)0x2);
      right = Builder::makeConst(&local_30,&local_48);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar2;
      rep = Builder::makeSequence(&local_30,(Expression *)left,(Expression *)right,type);
      replaceCurrent(this,(Expression *)rep);
      Literal::~Literal(&local_48);
    }
  }
  return;
}

Assistant:

void visitRefIsNull(RefIsNull* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    // Optimizing RefIsNull is not that obvious, since even if we know the
    // result evaluates to 0 or 1 then the replacement may not actually save
    // code size, since RefIsNull is a single byte while adding a Const of 0
    // would be two bytes. Other factors are that we can remove the input and
    // the added drop on it if it has no side effects, and that replacing with a
    // constant may allow further optimizations later. For now, replace with a
    // constant, but this warrants more investigation. TODO

    Builder builder(*getModule());
    if (curr->value->type.isNonNullable()) {
      replaceCurrent(
        builder.makeSequence(builder.makeDrop(curr->value),
                             builder.makeConst(Literal::makeZero(Type::i32))));
    } else {
      skipCast(curr->value);
    }
  }